

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O1

void VP8TBufferClear(VP8TBuffer *b)

{
  VP8Tokens *pVVar1;
  VP8Tokens *ptr;
  int iVar2;
  
  if (b != (VP8TBuffer *)0x0) {
    ptr = b->pages;
    while (ptr != (VP8Tokens *)0x0) {
      pVVar1 = ptr->next;
      WebPSafeFree(ptr);
      ptr = pVVar1;
    }
    b->tokens = (uint16_t *)0x0;
    b->pages = (VP8Tokens *)0x0;
    b->last_page = &b->pages;
    b->left = 0;
    iVar2 = 0x2000;
    if (0x2000 < b->page_size) {
      iVar2 = b->page_size;
    }
    b->page_size = iVar2;
    b->error = 0;
  }
  return;
}

Assistant:

void VP8TBufferClear(VP8TBuffer* const b) {
  if (b != NULL) {
    VP8Tokens* p = b->pages;
    while (p != NULL) {
      VP8Tokens* const next = p->next;
      WebPSafeFree(p);
      p = next;
    }
    VP8TBufferInit(b, b->page_size);
  }
}